

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O1

char * __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::PrintFractionalDigitsFast
          (anon_unknown_0 *this,uint128 v,char *start,int exp,size_t precision)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  byte *pbVar8;
  char *p;
  ulong uVar9;
  ulong uVar10;
  undefined4 in_register_00000084;
  long lVar11;
  long lVar12;
  bool bVar13;
  
  lVar11 = CONCAT44(in_register_00000084,exp);
  pbVar8 = (byte *)v.hi_;
  bVar4 = 0x80 - (char)start;
  uVar10 = (long)this << (bVar4 & 0x3f);
  uVar5 = 0;
  if ((bVar4 & 0x40) == 0) {
    uVar5 = uVar10;
    uVar10 = v.lo_ << (bVar4 & 0x3f) | (ulong)this >> 0x40 - (bVar4 & 0x3f);
  }
  lVar12 = lVar11;
  if (lVar11 != 0) {
    do {
      lVar12 = lVar11;
      if (uVar5 == 0) break;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar5;
      uVar9 = SUB168(auVar1 * ZEXT816(10),8);
      uVar5 = SUB168(auVar1 * ZEXT816(10),0);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar10;
      uVar6 = SUB168(auVar2 * ZEXT816(10),0);
      uVar10 = uVar6 + uVar9;
      *pbVar8 = SUB161(auVar2 * ZEXT816(10),8) + '0' + CARRY8(uVar6,uVar9);
      pbVar8 = pbVar8 + 1;
      lVar12 = lVar11 + -1;
      bVar13 = lVar11 != 1;
      lVar11 = lVar12;
    } while (bVar13);
  }
  while( true ) {
    if (lVar12 == 0) {
      pbVar7 = pbVar8;
      if ((long)uVar10 < 0) {
        while( true ) {
          do {
            pbVar7 = pbVar7 + -1;
            bVar4 = *pbVar7;
          } while (bVar4 == 0x2e);
          if (bVar4 != 0x39) break;
          *pbVar7 = 0x30;
        }
        *pbVar7 = bVar4 + 1;
      }
      return (char *)pbVar8;
    }
    if (uVar10 == 0) break;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar10;
    uVar10 = SUB168(auVar3 * ZEXT816(10),0);
    *pbVar8 = SUB161(auVar3 * ZEXT816(10),8) | 0x30;
    pbVar8 = pbVar8 + 1;
    lVar12 = lVar12 + -1;
  }
  return (char *)pbVar8;
}

Assistant:

char* PrintFractionalDigitsFast(uint128 v,
                                char* start,
                                int exp,
                                size_t precision) {
  char *p = start;
  v <<= (128 - exp);
  auto high = static_cast<uint64_t>(v >> 64);
  auto low = static_cast<uint64_t>(v);

  // While we have digits to print and `low` is not empty, do the long
  // multiplication.
  while (precision > 0 && low != 0) {
    char carry = MultiplyBy10WithCarry(&low, 0);
    carry = MultiplyBy10WithCarry(&high, carry);

    *p++ = carry + '0';
    --precision;
  }

  // Now `low` is empty, so use a faster approach for the rest of the digits.
  // This block is pretty much the same as the main loop for the 64-bit case
  // above.
  while (precision > 0) {
    if (!high) return p;
    *p++ = MultiplyBy10WithCarry(&high, 0) + '0';
    --precision;
  }

  // We need to round.
  if (high < 0x8000000000000000) {
    // We round down, so nothing to do.
  } else if (high > 0x8000000000000000 || low != 0) {
    // We round up.
    RoundUp(p - 1);
  } else {
    RoundToEven(p - 1);
  }

  return p;
}